

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O1

MatchResult __thiscall
r_exec::HLPController::check_predicted_evidences(HLPController *this,_Fact *target,_Fact **evidence)

{
  pointer pcVar1;
  pointer pcVar2;
  byte bVar3;
  int iVar4;
  MatchResult MVar5;
  ulong uVar6;
  _Fact *p_Var7;
  long c;
  int64_t iVar8;
  list<r_exec::HLPController::PEEntry> *this_00;
  float fVar9;
  float fVar10;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->predicted_evidences);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  uVar6 = (*Now)();
  c = (this->predicted_evidences).evidences.used_cells_head;
  if (c == -1) {
    p_Var7 = (_Fact *)0x0;
    MVar5 = MATCH_FAILURE;
  }
  else {
    this_00 = &(this->predicted_evidences).evidences;
    do {
      pcVar1 = (this_00->cells).
               super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = (**(code **)(**(long **)&pcVar1[c].data.super_EEntry + 0x70))();
      pcVar2 = (this_00->cells).
               super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((bVar3 | *(uint64_t *)((long)&pcVar1[c].data.super_EEntry + 0x10) < uVar6) == 1) {
        iVar8 = pcVar2[c].next;
        r_code::list<r_exec::HLPController::PEEntry>::__erase(this_00,c);
      }
      else {
        MVar5 = _Fact::is_evidence(*(_Fact **)&pcVar2[c].data.super_EEntry,target);
        if (MVar5 != MATCH_FAILURE) {
          fVar9 = _Fact::get_cfd(target);
          fVar10 = _Fact::get_cfd(*(_Fact **)
                                   &(this_00->cells).
                                    super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                                    ._M_impl.super__Vector_impl_data._M_start[c].data.super_EEntry);
          if (fVar9 < fVar10) {
            p_Var7 = *(_Fact **)
                      &(this_00->cells).
                       super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start[c].data.super_EEntry;
            goto LAB_0017650b;
          }
        }
        iVar8 = (this_00->cells).
                super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start[c].next;
      }
      c = iVar8;
    } while (iVar8 != -1);
    MVar5 = MATCH_FAILURE;
    p_Var7 = (_Fact *)0x0;
  }
LAB_0017650b:
  *evidence = p_Var7;
  pthread_mutex_unlock((pthread_mutex_t *)&this->predicted_evidences);
  return MVar5;
}

Assistant:

MatchResult HLPController::check_predicted_evidences(_Fact *target, _Fact *&evidence)
{
    MatchResult r = MATCH_FAILURE;
    std::lock_guard<std::mutex> guard(predicted_evidences.mutex);
    uint64_t now = Now();
    r_code::list<PEEntry>::const_iterator e;

    for (e = predicted_evidences.evidences.begin(); e != predicted_evidences.evidences.end();) {
        if ((*e).is_too_old(now)) { // garbage collection. // garbage collection.
            e = predicted_evidences.evidences.erase(e);
        } else {
            if ((r = (*e).evidence->is_evidence(target)) != MATCH_FAILURE) {
                if (target->get_cfd() < (*e).evidence->get_cfd()) {
                    evidence = (*e).evidence;
                    return r;
                } else {
                    r = MATCH_FAILURE;
                }
            }

            ++e;
        }
    }

    evidence = nullptr;
    return r;
}